

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
::set_simplex(Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
              *this,diameter_entry_t _simplex,dimension_t _dim)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  size_type __new_size;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  aRStack_28 [8];
  pointer local_20;
  
  this->idx_below =
       _simplex.
       super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
       .second.index.index;
  this->idx_above = 0;
  iVar1 = (int)CONCAT71(in_register_00000011,_dim);
  this->k = (dimension_t)(iVar1 + 1);
  (this->simplex).
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
  .first = _simplex.
           super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
           .first;
  (this->simplex).
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
  .second.index =
       _simplex.
       super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<false,_unsigned_long,_float>_>::entry_plain_t>
       .second.index.index;
  __new_size = (size_type)(iVar1 + 1);
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,__new_size);
  local_20 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned_long,float>>,Gudhi::ripser::TParams<false,unsigned_long,float>>
  ::
  get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (aRStack_28,(simplex_t)this->parent,(dimension_t)this->idx_below,iVar1,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)(ulong)(uint)((int)((ulong)((long)(this->dist->neighbors).
                                                  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->dist->neighbors).
                                                 super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x55555555));
  std::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ::resize(&this->neighbor_it,__new_size);
  std::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ::resize(&this->neighbor_end,__new_size);
  if (-1 < _dim) {
    uVar2 = 1;
    if ('\x01' < (char)(iVar1 + 1U)) {
      uVar2 = iVar1 + 1U & 0xff;
    }
    uVar3 = 0;
    do {
      iVar1 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3];
      (this->neighbor_it).
      super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar3].current._M_current =
           *(pointer *)
            ((long)&(this->dist->neighbors).
                    super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar1].
                    super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                    ._M_impl + 8);
      (this->neighbor_end).
      super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar3].current._M_current =
           (this->dist->neighbors).
           super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar1].
           super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void set_simplex(const diameter_entry_t _simplex, const dimension_t _dim) {
      idx_below = parent.get_index(_simplex);
      idx_above = 0;
      k = _dim + 1;
      simplex = _simplex;
      vertices.resize(_dim + 1);
      parent.get_simplex_vertices(idx_below, _dim, dist.size(), vertices.rbegin());

      neighbor_it.resize(_dim + 1);
      neighbor_end.resize(_dim + 1);
      for (dimension_t i = 0; i <= _dim; ++i) {
        auto v = vertices[i];
        neighbor_it[i] = dist.neighbors[v].rbegin();
        neighbor_end[i] = dist.neighbors[v].rend();
      }
    }